

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O0

Node * __thiscall
QTriangulator<unsigned_short>::SimpleToMonotone::searchEdgeLeftOfEdge
          (SimpleToMonotone *this,int edgeIndex)

{
  bool bVar1;
  long in_RDI;
  Node *result;
  Node *current;
  int in_stack_00000028;
  int in_stack_0000002c;
  SimpleToMonotone *in_stack_00000030;
  Node *local_20;
  Node *local_18;
  
  local_18 = *(Node **)(in_RDI + 8);
  local_20 = (Node *)0x0;
  while (local_18 != (Node *)0x0) {
    bVar1 = edgeIsLeftOfEdge(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
    if (bVar1) {
      local_18 = local_18->left;
    }
    else {
      local_20 = local_18;
      local_18 = local_18->right;
    }
  }
  return local_20;
}

Assistant:

QRBTree<int>::Node *QTriangulator<T>::SimpleToMonotone::searchEdgeLeftOfEdge(int edgeIndex) const
{
    QRBTree<int>::Node *current = m_edgeList.root;
    QRBTree<int>::Node *result = nullptr;
    while (current) {
        if (edgeIsLeftOfEdge(edgeIndex, current->data)) {
            current = current->left;
        } else {
            result = current;
            current = current->right;
        }
    }
    return result;
}